

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

vector<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>
* __thiscall
adios2::core::Engine::DoAllRelativeStepsBlocksInfo
          (vector<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>
           *__return_storage_ptr__,Engine *this,Variable<float> *variable)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"DoAllRelativeStepsBlocksInfo",&local_39);
  ThrowUp(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::map<size_t, std::vector<VariableStruct::BPInfo>>
Engine::DoAllStepsBlocksInfoStruct(const VariableStruct &variable) const
{
    ThrowUp("DoAllStepsBlocksInfo");
    return std::map<size_t, std::vector<VariableStruct::BPInfo>>();
}